

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

int anon_unknown.dwarf_7314::RtMidi_compiledapis(lua_State *L)

{
  pointer pAVar1;
  size_type sVar2;
  reference pvVar3;
  ulong local_40;
  size_t i;
  undefined1 auStack_28 [8];
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  lua_State *L_local;
  
  auStack_28 = (undefined1  [8])0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)L;
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::vector
            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)auStack_28);
  RtMidi::getCompiledApi((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)auStack_28);
  pAVar1 = apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  sVar2 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::size
                    ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)auStack_28);
  lua_createtable(pAVar1,sVar2 & 0xffffffff,0);
  local_40 = 0;
  while( true ) {
    sVar2 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::size
                      ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)auStack_28);
    pAVar1 = apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (sVar2 <= local_40) break;
    pvVar3 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                       ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)auStack_28,local_40);
    lua_pushinteger(pAVar1,*pvVar3);
    lua_rawseti(apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xfffffffe,(int)local_40 + 1);
    local_40 = local_40 + 1;
  }
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~vector
            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)auStack_28);
  return 1;
}

Assistant:

int RtMidi_compiledapis(lua_State *L) {
	auto apis = std::vector<RtMidi::Api> { };
	RtMidi::getCompiledApi(apis);
	lua_createtable(L, apis.size(), 0);
	for (std::size_t i = 0; i < apis.size(); ++i) {
		lua_pushinteger(L, apis[i]);
		lua_rawseti(L, -2, i + 1);
	}
	return 1;
}